

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,duckdb_fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
::operator()(padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,duckdb_fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
             *this,wchar_t **it)

{
  wchar_t wVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  char *digits;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar18 [16];
  
  lVar8 = *(long *)(this + 0x10);
  if (lVar8 != 0) {
    pwVar6 = *it;
    if (0 < lVar8) {
      pcVar9 = *(char **)(this + 8);
      lVar8 = lVar8 + 1;
      do {
        *pwVar6 = (int)*pcVar9;
        pcVar9 = pcVar9 + 1;
        pwVar6 = pwVar6 + 1;
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
    *it = pwVar6;
  }
  auVar5 = _DAT_01dd8ba0;
  auVar4 = _DAT_01dd7b40;
  auVar3 = _DAT_01dd7b30;
  pwVar7 = *it;
  lVar8 = *(long *)(this + 0x20);
  pwVar6 = pwVar7;
  if (lVar8 != 0) {
    pwVar6 = pwVar7 + lVar8;
    wVar1 = *(wchar_t *)(this + 0x18);
    uVar10 = lVar8 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
    auVar15._8_4_ = (int)uVar10;
    auVar15._0_8_ = uVar10;
    auVar15._12_4_ = (int)(uVar10 >> 0x20);
    lVar11 = 0;
    auVar15 = auVar15 ^ _DAT_01dd7b40;
    do {
      auVar17._8_4_ = (int)lVar11;
      auVar17._0_8_ = lVar11;
      auVar17._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar18 = (auVar17 | auVar3) ^ auVar4;
      iVar16 = auVar15._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar16 && auVar15._0_4_ < auVar18._0_4_ ||
                  iVar16 < auVar18._4_4_) & 1)) {
        pwVar7[lVar11] = wVar1;
      }
      if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
          auVar18._12_4_ <= auVar15._12_4_) {
        pwVar7[lVar11 + 1] = wVar1;
      }
      auVar17 = (auVar17 | auVar5) ^ auVar4;
      iVar19 = auVar17._4_4_;
      if (iVar19 <= iVar16 && (iVar19 != iVar16 || auVar17._0_4_ <= auVar15._0_4_)) {
        pwVar7[lVar11 + 2] = wVar1;
        pwVar7[lVar11 + 3] = wVar1;
      }
      lVar11 = lVar11 + 4;
    } while ((uVar10 - ((uint)(lVar8 + 0x3fffffffffffffffU) & 3)) + 4 != lVar11);
  }
  *it = pwVar6;
  lVar8 = *(long *)(this + 0x28);
  iVar16 = *(int *)(this + 0x30);
  if (*(char *)(*(long *)(lVar8 + 8) + 8) == 'x') {
    pcVar9 = "0123456789abcdef";
  }
  else {
    pcVar9 = "0123456789ABCDEF";
  }
  pwVar7 = pwVar6 + iVar16;
  uVar10 = *(ulong *)(lVar8 + 0x10);
  uVar12 = *(ulong *)(lVar8 + 0x18);
  do {
    pwVar7 = pwVar7 + -1;
    *pwVar7 = (int)pcVar9[(uint)uVar10 & 0xf];
    bVar13 = 0xf < uVar10;
    bVar14 = uVar12 != 0;
    uVar2 = -uVar12;
    uVar10 = uVar12 << 0x3c | uVar10 >> 4;
    uVar12 = uVar12 >> 4;
  } while (bVar14 || uVar2 < bVar13);
  *it = pwVar6 + iVar16;
  return;
}

Assistant:

FMT_CONSTEXPR size_t size() const { return size_; }